

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O2

void __thiscall AnalyserUnits_cn_Test::TestBody(AnalyserUnits_cn_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_130;
  allocator_type local_177;
  allocator<char> local_176;
  allocator<char> local_175;
  allocator<char> local_174;
  allocator<char> local_173;
  allocator<char> local_172;
  allocator<char> local_171;
  unsigned_long local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedIssues,"analyser/units/cn.cellml",(allocator<char> *)&local_170);
  fileContents((string *)&analyser);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&expectedIssues);
  expectedIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&analyser,"size_t(0)","parser->issueCount()",
             (unsigned_long *)&expectedIssues,&local_170);
  if ((char)analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&expectedIssues);
    if (analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)analyser.
                         super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_170,(Message *)&expectedIssues);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expectedIssues);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,
             "The units in \'b = 3.0\' in component \'main\' are not equivalent. \'b\' is \'dimensionless\' while \'3.0\' is in \'second\'."
             ,(allocator<char> *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,
             "The units in \'c = 5.0\' in component \'main\' are not equivalent. \'c\' is \'dimensionless\' while \'5.0\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,(allocator<char> *)&gtest_trace_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,
             "The units in \'d = 7.0\' in component \'main\' are not equivalent. \'d\' is \'dimensionless\' while \'7.0\' is in \'frog\'."
             ,&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             "The units in \'e = 9.0\' in component \'main\' are not equivalent. \'e\' is \'dimensionless\' while \'9.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,&local_172);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,
             "The units in \'g = 13.0e3\' in component \'main\' are not equivalent. \'g\' is \'dimensionless\' while \'13.0e3\' is in \'second\'."
             ,&local_173);
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,
             "The units in \'h = 15.0e5\' in component \'main\' are not equivalent. \'h\' is \'dimensionless\' while \'15.0e5\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,&local_174);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,
             "The units in \'i = 17.0e7\' in component \'main\' are not equivalent. \'i\' is \'dimensionless\' while \'17.0e7\' is in \'frog\'."
             ,&local_175);
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,
             "The units in \'j = 19.0e9\' in component \'main\' are not equivalent. \'j\' is \'dimensionless\' while \'19.0e9\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,&local_176);
  __l._M_len = 8;
  __l._M_array = (iterator)&analyser;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,&local_177);
  lVar1 = 0xe0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             CONCAT71(analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      (char)analyser.
                            super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr));
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_130,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x82,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Analyser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_170,
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserUnits, cn)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/cn.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'b = 3.0' in component 'main' are not equivalent. 'b' is 'dimensionless' while '3.0' is in 'second'.",
        "The units in 'c = 5.0' in component 'main' are not equivalent. 'c' is 'dimensionless' while '5.0' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in 'd = 7.0' in component 'main' are not equivalent. 'd' is 'dimensionless' while '7.0' is in 'frog'.",
        "The units in 'e = 9.0' in component 'main' are not equivalent. 'e' is 'dimensionless' while '9.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        "The units in 'g = 13.0e3' in component 'main' are not equivalent. 'g' is 'dimensionless' while '13.0e3' is in 'second'.",
        "The units in 'h = 15.0e5' in component 'main' are not equivalent. 'h' is 'dimensionless' while '15.0e5' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in 'i = 17.0e7' in component 'main' are not equivalent. 'i' is 'dimensionless' while '17.0e7' is in 'frog'.",
        "The units in 'j = 19.0e9' in component 'main' are not equivalent. 'j' is 'dimensionless' while '19.0e9' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}